

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::DecodeCompressed(S2Loop *this,Decoder *decoder,int snap_level)

{
  byte bVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  S2Point *__s;
  undefined7 extraout_var;
  uchar *limit;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  uint unaff_R15D;
  Span<Vector3<double>_> points;
  S2LatLngRect SStack_58;
  
  pbVar10 = decoder->buf_;
  pbVar2 = decoder->limit_;
  if (pbVar10 < pbVar2) {
    unaff_R15D = *pbVar10 & 0x7f;
    pbVar7 = pbVar10 + 1;
    if ((char)*pbVar10 < '\0') {
      if (pbVar2 <= pbVar10 + 1) goto LAB_002017ca;
      unaff_R15D = unaff_R15D | (pbVar10[1] & 0x7f) << 7;
      pbVar7 = pbVar10 + 2;
      if ((char)pbVar10[1] < '\0') {
        if (pbVar2 <= pbVar10 + 2) goto LAB_002017ca;
        unaff_R15D = unaff_R15D | (pbVar10[2] & 0x7f) << 0xe;
        pbVar7 = pbVar10 + 3;
        if ((char)pbVar10[2] < '\0') {
          if (pbVar2 <= pbVar10 + 3) goto LAB_002017ca;
          unaff_R15D = unaff_R15D | (pbVar10[3] & 0x7f) << 0x15;
          pbVar7 = pbVar10 + 4;
          if ((char)pbVar10[3] < '\0') {
            if (pbVar2 <= pbVar10 + 4) goto LAB_002017ca;
            unaff_R15D = (uint)pbVar10[4] << 0x1c | unaff_R15D;
            pbVar7 = (byte *)0x0;
            if (pbVar10[4] < 0x10) {
              pbVar7 = pbVar10 + 5;
            }
          }
        }
      }
    }
  }
  else {
LAB_002017ca:
    pbVar7 = (byte *)0x0;
  }
  if (pbVar7 == (byte *)0x0) {
    return false;
  }
  decoder->buf_ = pbVar7;
  if ((uint)FLAGS_s2polygon_decode_max_num_vertices <= unaff_R15D - 1) {
    return false;
  }
  (this->unindexed_contains_calls_).super___atomic_base<int>._M_i = 0;
  MutableS2ShapeIndex::Clear(&this->index_);
  if ((this->owns_vertices_ == true) && (this->vertices_ != (S2Point *)0x0)) {
    operator_delete__(this->vertices_);
  }
  this->num_vertices_ = unaff_R15D;
  uVar11 = (ulong)(int)unaff_R15D;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
    uVar9 = SUB168(auVar3 * ZEXT816(0x18),0);
  }
  __s = (S2Point *)operator_new__(uVar9);
  memset(__s,0,((uVar11 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  this->vertices_ = __s;
  this->owns_vertices_ = true;
  points.len_ = uVar11;
  points.ptr_ = __s;
  bVar4 = S2DecodePointsCompressed(decoder,snap_level,points);
  if (!bVar4) {
    return false;
  }
  pbVar10 = decoder->buf_;
  pbVar2 = decoder->limit_;
  uVar8 = (uint)CONCAT71(extraout_var,bVar4);
  if (pbVar10 < pbVar2) {
    bVar1 = *pbVar10;
    uVar8 = (uint)bVar1;
    uVar5 = (uint)bVar1;
    pbVar7 = pbVar10 + 1;
    uVar6 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      if (pbVar2 <= pbVar10 + 1) goto LAB_002018e5;
      pbVar7 = pbVar10 + 2;
      uVar6 = uVar5;
      if ((char)pbVar10[1] < '\0') {
        if (pbVar2 <= pbVar10 + 2) goto LAB_002018e5;
        pbVar7 = pbVar10 + 3;
        if ((char)pbVar10[2] < '\0') {
          if (pbVar2 <= pbVar10 + 3) goto LAB_002018e5;
          pbVar7 = pbVar10 + 4;
          if ((char)pbVar10[3] < '\0') {
            uVar8 = (uint)bVar1;
            if (pbVar2 <= pbVar10 + 4) goto LAB_002018e5;
            pbVar7 = (byte *)0x0;
            if (pbVar10[4] < 0x10) {
              pbVar7 = pbVar10 + 5;
            }
          }
        }
      }
    }
  }
  else {
LAB_002018e5:
    pbVar7 = (byte *)0x0;
    uVar6 = uVar8;
  }
  if (pbVar7 == (byte *)0x0) {
    return false;
  }
  decoder->buf_ = pbVar7;
  uVar8 = uVar6 & 0xffffff01;
  this->origin_inside_ = SUB41(uVar8,0);
  if (pbVar7 < pbVar2) {
    uVar8 = *pbVar7 & 0x7f;
    pbVar10 = pbVar7 + 1;
    if (-1 < (char)*pbVar7) goto LAB_002019a2;
    if (pbVar7 + 1 < pbVar2) {
      uVar8 = uVar8 | (pbVar7[1] & 0x7f) << 7;
      pbVar10 = pbVar7 + 2;
      if (-1 < (char)pbVar7[1]) goto LAB_002019a2;
      if (pbVar7 + 2 < pbVar2) {
        uVar8 = uVar8 | (pbVar7[2] & 0x7f) << 0xe;
        pbVar10 = pbVar7 + 3;
        if (-1 < (char)pbVar7[2]) goto LAB_002019a2;
        if (pbVar7 + 3 < pbVar2) {
          uVar8 = uVar8 | (pbVar7[3] & 0x7f) << 0x15;
          pbVar10 = pbVar7 + 4;
          if (-1 < (char)pbVar7[3]) goto LAB_002019a2;
          if (pbVar7 + 4 < pbVar2) {
            uVar8 = uVar8 | (uint)pbVar7[4] << 0x1c;
            pbVar10 = (byte *)0x0;
            if (pbVar7[4] < 0x10) {
              pbVar10 = pbVar7 + 5;
            }
            goto LAB_002019a2;
          }
        }
      }
    }
  }
  pbVar10 = (byte *)0x0;
LAB_002019a2:
  if (pbVar10 == (byte *)0x0) {
    return false;
  }
  decoder->buf_ = pbVar10;
  this->depth_ = uVar8;
  if ((uVar6 & 2) == 0) {
    InitBound(this);
  }
  else {
    bVar4 = S2LatLngRect::Decode(&this->bound_,decoder);
    if (!bVar4) {
      return false;
    }
    S2LatLngRectBounder::ExpandForSubregions(&SStack_58,&this->bound_);
    (this->subregion_bound_).lng_.bounds_.c_[0] = SStack_58.lng_.bounds_.c_[0];
    (this->subregion_bound_).lng_.bounds_.c_[1] = SStack_58.lng_.bounds_.c_[1];
    (this->subregion_bound_).lat_.bounds_.c_[0] = SStack_58.lat_.bounds_.c_[0];
    (this->subregion_bound_).lat_.bounds_.c_[1] = SStack_58.lat_.bounds_.c_[1];
  }
  InitIndex(this);
  return true;
}

Assistant:

bool S2Loop::DecodeCompressed(Decoder* decoder, int snap_level) {
  // get_varint32 takes a uint32*, but num_vertices_ is signed.
  // Decode to a temporary variable to avoid reinterpret_cast.
  uint32 unsigned_num_vertices;
  if (!decoder->get_varint32(&unsigned_num_vertices)) {
    return false;
  }
  if (unsigned_num_vertices == 0 ||
      unsigned_num_vertices > FLAGS_s2polygon_decode_max_num_vertices) {
    return false;
  }
  ClearIndex();
  if (owns_vertices_) delete[] vertices_;
  num_vertices_ = unsigned_num_vertices;
  vertices_ = new S2Point[num_vertices_];
  owns_vertices_ = true;

  if (!S2DecodePointsCompressed(decoder, snap_level,
                                MakeSpan(vertices_, num_vertices_))) {
    return false;
  }
  uint32 properties_uint32;
  if (!decoder->get_varint32(&properties_uint32)) {
    return false;
  }
  const std::bitset<kNumProperties> properties(properties_uint32);
  origin_inside_ = properties.test(kOriginInside);

  uint32 unsigned_depth;
  if (!decoder->get_varint32(&unsigned_depth)) {
    return false;
  }
  depth_ = unsigned_depth;

  if (properties.test(kBoundEncoded)) {
    if (!bound_.Decode(decoder)) {
      return false;
    }
    subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
  } else {
    InitBound();
  }
  InitIndex();
  return true;
}